

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O1

void anon_unknown.dwarf_2d8e762::TreeChildrenIterator::Iterate<duckdb::PhysicalOperator>
               (PhysicalOperator *op,function<void_(const_duckdb::PhysicalOperator_&)> *callback)

{
  undefined8 *puVar1;
  undefined8 *local_30;
  undefined8 *local_28;
  
  (*op->_vptr_PhysicalOperator[5])(&local_30,op);
  puVar1 = local_30;
  while( true ) {
    if (puVar1 == local_28) {
      if (local_30 != (undefined8 *)0x0) {
        operator_delete(local_30);
      }
      return;
    }
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    (*callback->_M_invoker)((_Any_data *)callback,(PhysicalOperator *)*puVar1);
    puVar1 = puVar1 + 1;
  }
  std::__throw_bad_function_call();
}

Assistant:

void TreeChildrenIterator::Iterate(const PhysicalOperator &op,
                                   const std::function<void(const PhysicalOperator &child)> &callback) {
	for (auto &child : op.GetChildren()) {
		callback(child);
	}
}